

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FeatureSet * __thiscall
google::protobuf::DescriptorPool::Tables::InternFeatureSet(Tables *this,FeatureSet *features)

{
  bool bVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::unique_ptr<google::protobuf::FeatureSet>_>_>
  __x;
  pointer pFVar2;
  undefined1 local_58 [24];
  string local_40;
  undefined8 local_20;
  unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
  *result;
  FeatureSet *features_local;
  Tables *this_local;
  
  result = (unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
            *)features;
  features_local = (FeatureSet *)this;
  MessageLite::SerializeAsString_abi_cxx11_((string *)(local_58 + 0x18),(MessageLite *)features);
  __x = absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
        ::
        operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_nullptr>
                  (&(this->feature_set_cache_).
                    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                   ,(string *)(local_58 + 0x18));
  std::__cxx11::string::~string((string *)(local_58 + 0x18));
  local_20 = __x;
  bVar1 = std::operator==(__x,(nullptr_t)0x0);
  if (bVar1) {
    std::make_unique<google::protobuf::FeatureSet,google::protobuf::FeatureSet>
              ((FeatureSet *)local_58);
    std::
    unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>::
    operator=((unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
               *)local_20,
              (unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
               *)local_58);
    std::
    unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>::
    ~unique_ptr((unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
                 *)local_58);
  }
  pFVar2 = std::
           unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
           ::get((unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
                  *)local_20);
  return pFVar2;
}

Assistant:

const FeatureSet* DescriptorPool::Tables::InternFeatureSet(
    FeatureSet&& features) {
  // Use the serialized feature set as the cache key.  If multiple equivalent
  // feature sets serialize to different strings, that just bloats the cache a
  // little.
  auto& result = feature_set_cache_[features.SerializeAsString()];
  if (result == nullptr) {
    result = absl::make_unique<FeatureSet>(std::move(features));
  }
  return result.get();
}